

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O0

math_section * parse_formula_section(char *line,char *full_line)

{
  _Bool _Var1;
  int iVar2;
  ushort **ppuVar3;
  long lVar4;
  math_section *c;
  math_section *c_1;
  int formula;
  char *full_line_local;
  char *line_local;
  
  full_line_local = line;
  while( true ) {
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)(uint)(byte)*full_line_local] & 0x2000) == 0) break;
    full_line_local = full_line_local + 1;
  }
  _Var1 = is_all_number(full_line_local);
  if (_Var1) {
    line_local = (char *)mem_alloc(8);
    lVar4 = atol(full_line_local);
    *(int *)(line_local + 4) = (int)lVar4;
    *line_local = '\0';
  }
  else {
    iVar2 = parse_calculation_line(full_line_local,full_line);
    if (iVar2 == -1) {
      line_local = (char *)0x0;
    }
    else {
      line_local = (char *)mem_alloc(8);
      *(int *)(line_local + 4) = iVar2;
      *line_local = '\x01';
    }
  }
  return (math_section *)line_local;
}

Assistant:

static struct math_section *parse_formula_section(
    char *line, const char *full_line)
{
    int formula = -1;

    /* skip leading whitespace */
    while (isspace((unsigned char)*line))
        line++;

    if (is_all_number(line)) {
        struct math_section *c = mem_alloc(sizeof(struct math_section));
        c->calculation_index   = atol(line);
        c->is_calculation      = false;
        return c;
    }

    /* parse the formula so it can be calculated from */
    /* the formula is stored in the "formulas" array and */
    /* the index into the array is returned */
    formula = parse_calculation_line(line, full_line);
    if (formula == -1)
        return NULL;

    struct math_section *c = mem_alloc(sizeof(struct math_section));
    c->calculation_index   = formula;
    c->is_calculation      = true;

    return c;
}